

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# content_encoding.c
# Opt level: O3

CURLcode Curl_build_unencoding_stack(Curl_easy *data,char *enclist,int maybechunked)

{
  byte *pbVar1;
  undefined1 *puVar2;
  byte bVar3;
  int iVar4;
  contenc_writer *pcVar5;
  size_t sVar6;
  content_encoding **ppcVar7;
  size_t max;
  content_encoding *ce;
  content_encoding *handler;
  byte *pbVar8;
  
  do {
    for (; (iVar4 = Curl_isspace((uint)(byte)*enclist), iVar4 != 0 ||
           (bVar3 = *enclist, bVar3 == 0x2c)); enclist = (char *)((byte *)enclist + 1)) {
    }
    sVar6 = 1;
    max = 0;
    pbVar8 = (byte *)enclist;
    while ((bVar3 != 0 && (bVar3 != 0x2c))) {
      iVar4 = Curl_isspace((uint)bVar3);
      if (iVar4 == 0) {
        max = sVar6;
      }
      pbVar1 = pbVar8 + 1;
      pbVar8 = pbVar8 + 1;
      sVar6 = sVar6 + 1;
      bVar3 = *pbVar1;
    }
    if ((maybechunked == 0) || (max != 7)) {
      if (max != 0) goto LAB_0011048d;
    }
    else {
      iVar4 = Curl_strncasecompare(enclist,"chunked",7);
      if (iVar4 == 0) {
LAB_0011048d:
        ppcVar7 = encodings;
        handler = &identity_encoding;
        do {
          ppcVar7 = ppcVar7 + 1;
          iVar4 = Curl_strncasecompare(enclist,handler->name,max);
          if (((iVar4 != 0) && (handler->name[max] == '\0')) ||
             ((handler->alias != (char *)0x0 &&
              ((iVar4 = Curl_strncasecompare(enclist,handler->alias,max), iVar4 != 0 &&
               (handler->alias[max] == '\0')))))) goto LAB_001104eb;
          handler = *ppcVar7;
        } while (handler != (content_encoding *)0x0);
        handler = (content_encoding *)0x0;
LAB_001104eb:
        pcVar5 = (data->req).writer_stack;
        if (pcVar5 == (contenc_writer *)0x0) {
          pcVar5 = new_unencoding_writer(data,&client_encoding,(contenc_writer *)0x0);
          (data->req).writer_stack = pcVar5;
          if (pcVar5 == (contenc_writer *)0x0) {
            return CURLE_OUT_OF_MEMORY;
          }
        }
        if (handler == (content_encoding *)0x0) {
          handler = &error_encoding;
        }
        pcVar5 = new_unencoding_writer(data,handler,pcVar5);
        if (pcVar5 == (contenc_writer *)0x0) {
          return CURLE_OUT_OF_MEMORY;
        }
        (data->req).writer_stack = pcVar5;
      }
      else {
        puVar2 = &(data->req).field_0xd8;
        *puVar2 = *puVar2 | 0x20;
        Curl_httpchunk_init(data);
      }
    }
    enclist = (char *)pbVar8;
    if (*pbVar8 == 0) {
      return CURLE_OK;
    }
  } while( true );
}

Assistant:

CURLcode Curl_build_unencoding_stack(struct Curl_easy *data,
                                     const char *enclist, int maybechunked)
{
  struct SingleRequest *k = &data->req;

  do {
    const char *name;
    size_t namelen;

    /* Parse a single encoding name. */
    while(ISSPACE(*enclist) || *enclist == ',')
      enclist++;

    name = enclist;

    for(namelen = 0; *enclist && *enclist != ','; enclist++)
      if(!ISSPACE(*enclist))
        namelen = enclist - name + 1;

    /* Special case: chunked encoding is handled at the reader level. */
    if(maybechunked && namelen == 7 && strncasecompare(name, "chunked", 7)) {
      k->chunk = TRUE;             /* chunks coming our way. */
      Curl_httpchunk_init(data);   /* init our chunky engine. */
    }
    else if(namelen) {
      const struct content_encoding *encoding = find_encoding(name, namelen);
      struct contenc_writer *writer;

      if(!k->writer_stack) {
        k->writer_stack = new_unencoding_writer(data, &client_encoding, NULL);

        if(!k->writer_stack)
          return CURLE_OUT_OF_MEMORY;
      }

      if(!encoding)
        encoding = &error_encoding;  /* Defer error at stack use. */

      /* Stack the unencoding stage. */
      writer = new_unencoding_writer(data, encoding, k->writer_stack);
      if(!writer)
        return CURLE_OUT_OF_MEMORY;
      k->writer_stack = writer;
    }
  } while(*enclist);

  return CURLE_OK;
}